

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::AMFImporter::Find_ConvertedNode
          (AMFImporter *this,string *pID,list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList,
          aiNode **pNode)

{
  aiNode *this_00;
  bool bVar1;
  size_t __n;
  _List_node_base *p_Var2;
  aiString node_name;
  allocator local_451;
  void *local_450;
  ulong local_448;
  aiString local_42c;
  
  std::__cxx11::string::string((string *)&local_450,(pID->_M_dataplus)._M_p,&local_451);
  __n = 0x3ff;
  if ((local_448 & 0xfffffc00) == 0) {
    __n = local_448 & 0xffffffff;
  }
  local_42c.length = (ai_uint32)__n;
  memcpy(local_42c.data,local_450,__n);
  local_42c.data[__n] = '\0';
  std::__cxx11::string::~string((string *)&local_450);
  p_Var2 = (_List_node_base *)pNodeList;
  do {
    p_Var2 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var2->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)pNodeList) goto LAB_003c8608;
    this_00 = (aiNode *)p_Var2[1]._M_next;
    bVar1 = aiString::operator==((aiString *)this_00,&local_42c);
  } while (!bVar1);
  if (pNode != (aiNode **)0x0) {
    *pNode = this_00;
  }
LAB_003c8608:
  return p_Var2 != (_List_node_base *)pNodeList;
}

Assistant:

bool AMFImporter::Find_ConvertedNode(const std::string& pID, std::list<aiNode*>& pNodeList, aiNode** pNode) const
{
aiString node_name(pID.c_str());

	for(aiNode* node: pNodeList)
	{
		if(node->mName == node_name)
		{
			if(pNode != nullptr) *pNode = node;

			return true;
		}
	}// for(aiNode* node: pNodeList)

	return false;
}